

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# katajainen.c
# Opt level: O3

void BoundaryPM(Node *(*lists) [2],Node *leaves,int numsymbols,NodePool *pool,int index)

{
  long *plVar1;
  Node *pNVar2;
  Node *pNVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  Node *pNVar7;
  ulong uVar8;
  int index_00;
  long lVar9;
  Node **ppNVar10;
  bool bVar11;
  
  lVar9 = (long)index;
  iVar5 = lists[lVar9][1]->count;
  bVar4 = iVar5 < numsymbols;
  bVar11 = index != 0;
  if ((bVar11) || (iVar5 < numsymbols)) {
    ppNVar10 = lists[lVar9] + 1;
    lVar9 = lVar9 + -1;
    index_00 = index + -1;
    do {
      pNVar2 = pool->next;
      pool->next = pNVar2 + 1;
      pNVar7 = *ppNVar10;
      (*(Node *(*) [2])(ppNVar10 + -1))[0] = pNVar7;
      *ppNVar10 = pNVar2;
      if (!bVar11) {
        uVar6 = leaves[iVar5].weight;
        pNVar7 = (Node *)0x0;
LAB_00127dcc:
        pNVar2->weight = uVar6;
        pNVar2->count = iVar5 + 1;
        pNVar2->tail = pNVar7;
        return;
      }
      pNVar3 = ppNVar10[-2];
      uVar8 = pNVar3->weight + *(long *)ppNVar10[-3];
      if ((bVar4) && (uVar6 = leaves[iVar5].weight, uVar6 < uVar8)) {
        pNVar7 = pNVar7->tail;
        goto LAB_00127dcc;
      }
      pNVar2->weight = uVar8;
      pNVar2->count = iVar5;
      pNVar2->tail = pNVar3;
      BoundaryPM(lists,leaves,numsymbols,pool,index_00);
      plVar1 = (long *)(ppNVar10 + -2);
      ppNVar10 = ppNVar10 + -2;
      iVar5 = *(int *)(*plVar1 + 0x10);
      bVar4 = iVar5 < numsymbols;
      index_00 = index_00 + -1;
      bVar11 = lVar9 != 0;
      lVar9 = lVar9 + -1;
    } while ((bVar11) || (iVar5 < numsymbols));
  }
  return;
}

Assistant:

static void BoundaryPM(Node* (*lists)[2], Node* leaves, int numsymbols,
                       NodePool* pool, int index) {
  Node* newchain;
  Node* oldchain;
  int lastcount = lists[index][1]->count;  /* Count of last chain of list. */

  if (index == 0 && lastcount >= numsymbols) return;

  newchain = pool->next++;
  oldchain = lists[index][1];

  /* These are set up before the recursive calls below, so that there is a list
  pointing to the new node, to let the garbage collection know it's in use. */
  lists[index][0] = oldchain;
  lists[index][1] = newchain;

  if (index == 0) {
    /* New leaf node in list 0. */
    InitNode(leaves[lastcount].weight, lastcount + 1, 0, newchain);
  } else {
    size_t sum = lists[index - 1][0]->weight + lists[index - 1][1]->weight;
    if (lastcount < numsymbols && sum > leaves[lastcount].weight) {
      /* New leaf inserted in list, so count is incremented. */
      InitNode(leaves[lastcount].weight, lastcount + 1, oldchain->tail,
          newchain);
    } else {
      InitNode(sum, lastcount, lists[index - 1][1], newchain);
      /* Two lookahead chains of previous list used up, create new ones. */
      BoundaryPM(lists, leaves, numsymbols, pool, index - 1);
      BoundaryPM(lists, leaves, numsymbols, pool, index - 1);
    }
  }
}